

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

int ns_hexdump(void *buf,int len,char *dst,int dst_len)

{
  int iVar1;
  int iVar2;
  char cVar3;
  uint uVar4;
  ulong uVar5;
  char ascii [17];
  char local_58 [32];
  ulong local_38;
  
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_58[0x10] = 0;
  if (len < 1) {
    uVar5 = 0;
    iVar2 = 0;
  }
  else {
    local_38 = (ulong)(uint)len;
    uVar5 = 0;
    iVar2 = 0;
    do {
      if ((uVar5 & 0xf) == 0) {
        if (uVar5 != 0) {
          iVar1 = snprintf(dst + iVar2,(long)(dst_len - iVar2),"  %s\n",local_58);
          iVar2 = iVar1 + iVar2;
        }
        iVar1 = snprintf(dst + iVar2,(long)(dst_len - iVar2),"%04x ",uVar5 & 0xffffffff);
        iVar2 = iVar1 + iVar2;
      }
      iVar1 = snprintf(dst + iVar2,(long)(dst_len - iVar2)," %02x",
                       (ulong)*(byte *)((long)buf + uVar5));
      iVar2 = iVar1 + iVar2;
      cVar3 = *(char *)((long)buf + uVar5);
      if ((byte)(*(char *)((long)buf + uVar5) + 0x81U) < 0xa1) {
        cVar3 = '.';
      }
      local_58[(uint)uVar5 & 0xf] = cVar3;
      local_58[(uVar5 & 0xf) + 1] = '\0';
      uVar5 = uVar5 + 1;
    } while (local_38 != uVar5);
  }
  if ((uVar5 & 0xf) != 0) {
    uVar4 = (uint)uVar5;
    do {
      uVar4 = uVar4 + 1;
      iVar1 = snprintf(dst + iVar2,(long)(dst_len - iVar2),"%s","   ");
      iVar2 = iVar1 + iVar2;
    } while ((uVar4 & 0xf) != 0);
  }
  iVar1 = snprintf(dst + iVar2,(long)(dst_len - iVar2),"  %s\n\n",local_58);
  return iVar1 + iVar2;
}

Assistant:

int ns_hexdump(const void *buf, int len, char *dst, int dst_len) {
  const unsigned char *p = (const unsigned char *) buf;
  char ascii[17] = "";
  int i, idx, n = 0;

  for (i = 0; i < len; i++) {
    idx = i % 16;
    if (idx == 0) {
      if (i > 0) n += snprintf(dst + n, dst_len - n, "  %s\n", ascii);
      n += snprintf(dst + n, dst_len - n, "%04x ", i);
    }
    n += snprintf(dst + n, dst_len - n, " %02x", p[i]);
    ascii[idx] = p[i] < 0x20 || p[i] > 0x7e ? '.' : p[i];
    ascii[idx + 1] = '\0';
  }

  while (i++ % 16) n += snprintf(dst + n, dst_len - n, "%s", "   ");
  n += snprintf(dst + n, dst_len - n, "  %s\n\n", ascii);

  return n;
}